

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O3

void Iso_ManPrintClasseSizes(Iso_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  
  pVVar1 = p->vClasses;
  if (0 < pVVar1->nSize) {
    lVar4 = 0;
    do {
      uVar3 = 0;
      if (pVVar1->pArray[lVar4] != (void *)0x0) {
        uVar2 = *(uint *)((long)pVVar1->pArray[lVar4] + 0x10);
        if ((int)uVar2 < 0) {
LAB_006e8cad:
          __assert_fail("i >= 0 && i < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIsoSlow.c"
                        ,300,"Iso_Obj_t *Iso_ManObj(Iso_Man_t *, int)");
        }
        uVar3 = 1;
        while( true ) {
          if (p->nObjs <= (int)uVar2) goto LAB_006e8cad;
          if (uVar2 == 0) break;
          uVar3 = (ulong)((int)uVar3 + 1);
          uVar2 = p->pObjs[uVar2].iClass;
          if ((int)uVar2 < 0) goto LAB_006e8cad;
        }
      }
      printf("%d ",uVar3);
      lVar4 = lVar4 + 1;
      pVVar1 = p->vClasses;
    } while (lVar4 < pVVar1->nSize);
  }
  putchar(10);
  return;
}

Assistant:

void Iso_ManPrintClasseSizes( Iso_Man_t * p )
{
    Iso_Obj_t * pIso, * pTemp;
    int i, Counter;
    Vec_PtrForEachEntry( Iso_Obj_t *, p->vClasses, pIso, i )
    {
        Counter = 0;
        for ( pTemp = pIso; pTemp; pTemp = Iso_ManObj(p, pTemp->iClass) )
            Counter++;
        printf( "%d ", Counter );
    }
    printf( "\n" );
}